

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O3

void __thiscall
cppcms::url_mapper::real_map
          (url_mapper *this,char *ckey,streamable **params,size_t params_no,ostream *output)

{
  char *pcVar1;
  data *pdVar2;
  long lVar3;
  url_mapper *puVar4;
  long lVar5;
  mapped_type *this_00;
  ulong uVar6;
  size_t sVar7;
  runtime_error *this_01;
  ulong uVar8;
  bool bVar9;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> direct;
  string_key real_key;
  string_key key;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mappings;
  undefined **local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  char *pcStack_268;
  char *local_260;
  undefined1 *puStack_258;
  locale local_250 [8];
  char *local_248;
  char local_240 [128];
  undefined1 local_1c0 [8];
  streambuf *local_1b8;
  ostream *poStack_1b0;
  ostringstream ss;
  char local_198 [96];
  ios_base local_138 [264];
  
  local_288 = (undefined **)booster::locale::ios_info::domain_id;
  local_280 = 0;
  uStack_278 = 0;
  local_270 = 0;
  pcStack_268 = (char *)0x0;
  local_260 = (char *)0x0;
  puStack_258 = (undefined1 *)0x0;
  std::locale::locale(local_250);
  local_248 = (char *)0x0;
  pcStack_268 = local_240;
  puStack_258 = local_1c0;
  local_288 = &PTR__steal_buffer_00286280;
  local_1b8 = (streambuf *)0x0;
  poStack_1b0 = (ostream *)0x0;
  local_260 = pcStack_268;
  if (((this->d).ptr_)->throws == false) {
    local_1b8 = (streambuf *)
                std::ios::rdbuf((streambuf *)(output + *(long *)(*(long *)output + -0x18)));
    poStack_1b0 = output;
  }
  key.end_ = ckey + -1;
  do {
    pcVar1 = key.end_ + 1;
    key.end_ = key.end_ + 1;
  } while (*pcVar1 != '\0');
  key.key_._M_dataplus._M_p = (pointer)&key.key_.field_2;
  key.key_._M_string_length = 0;
  key.key_.field_2._M_local_buf[0] = '\0';
  real_key.key_._M_dataplus._M_p = (pointer)&real_key.key_.field_2;
  real_key.begin_ = (char *)0x0;
  real_key.end_ = (char *)0x0;
  real_key.key_._M_string_length = 0;
  real_key.key_.field_2._M_local_buf[0] = '\0';
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key.begin_ = ckey;
  puVar4 = get_mapper_for_key(this,&key,&real_key,&direct);
  lVar5 = (long)direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  if ((ulong)(lVar5 * -0x5555555555555555) <= params_no) {
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mappings._M_t._M_impl.super__Rb_tree_header._M_header;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pdVar2 = (puVar4->d).ptr_;
      puVar4 = topmost(this);
      data::map(pdVar2,&real_key,&key,params,params_no,&((puVar4->d).ptr_)->helpers,&mappings,output
               );
    }
    else {
      uVar6 = 0;
      uVar8 = 1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::ios::copyfmt((ios *)((ostringstream *)&ss + *(long *)(_ss + -0x18)));
        filters::streamable::operator()(params[uVar6],(ostream *)&ss);
        std::__cxx11::stringbuf::str();
        this_00 = std::
                  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&mappings,
                               direct.
                               super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar6);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0]);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        uVar6 = ((long)direct.
                       super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)direct.
                       super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        bVar9 = uVar8 <= uVar6;
        lVar3 = uVar6 - uVar8;
        uVar6 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar9 && lVar3 != 0);
      pdVar2 = (puVar4->d).ptr_;
      puVar4 = topmost(this);
      data::map(pdVar2,&real_key,&key,params + lVar5 * 0xaaaaaaaaaaaaaab,
                params_no + lVar5 * 0x5555555555555555,&((puVar4->d).ptr_)->helpers,&mappings,output
               );
    }
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&mappings._M_t);
    std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::~vector(&direct);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)real_key.key_._M_dataplus._M_p != &real_key.key_.field_2) {
      operator_delete(real_key.key_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key.key_._M_dataplus._M_p != &key.key_.field_2) {
      operator_delete(key.key_._M_dataplus._M_p);
    }
    if (((this->d).ptr_)->throws == false) {
      if ((poStack_1b0 != (ostream *)0x0) && (local_1b8 != (streambuf *)0x0)) {
        std::ios::rdbuf((streambuf *)(poStack_1b0 + *(long *)(*(long *)poStack_1b0 + -0x18)));
      }
      pcVar1 = pcStack_268;
      local_1b8 = (streambuf *)0x0;
      poStack_1b0 = (ostream *)0x0;
      *local_260 = '\0';
      if (pcStack_268 == (char *)0x0) {
        std::ios::clear((int)output + (int)*(undefined8 *)(*(long *)output + -0x18));
      }
      else {
        sVar7 = strlen(pcStack_268);
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar1,sVar7);
      }
    }
    util::steal_buffer<128UL>::~steal_buffer((steal_buffer<128UL> *)&local_288);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x30);
  _ss = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&ss,
             "url_mapper: number of keywords is larger then number of actual parameters","");
  booster::runtime_error::runtime_error(this_01,(string *)&ss);
  *(undefined ***)this_01 = &PTR__runtime_error_00284840;
  (this_01->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void url_mapper::real_map(	char const *ckey,
					filters::streamable const * const *params,
					size_t params_no,
					std::ostream &output)
	{
		util::steal_buffer<> temp_buf;
		if(!d->throws)
			temp_buf.steal(output);
		try {
			string_key key=string_key::unowned(ckey);
			string_key real_key;
			std::vector<string_key> direct;
			url_mapper &mp = get_mapper_for_key(key,real_key,direct);
			if(params_no < direct.size())
				throw cppcms_error("url_mapper: number of keywords is larger then number of actual parameters");
			std::map<string_key,std::string> mappings;
			if(direct.size() == 0) {
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
			else {
				size_t direct_size = direct.size();
				filters::streamable const * const *key_params = params;
				params += direct_size;
				params_no -= direct_size;
				for(unsigned i=0;i<direct.size();i++) {
					std::ostringstream ss;
					ss.copyfmt(output);
					(*key_params[i])(ss);
					mappings[direct[i]]=ss.str();
				}
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
		}
		catch(cppcms_error const &e) {
			if(d->throws) {
				throw;
			}
			BOOSTER_ERROR("cppcms") << e.what() <<'\n' << booster::trace(e);
			temp_buf.release();
			output<<"/this_is_an_invalid_url_generated_by_url_mapper";
			return;
		}
		if(!d->throws) {
			temp_buf.release();
			output << temp_buf.c_str();
		}
	}